

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

BTLeafNode * __thiscall storage::BTLeafNode::split(BTLeafNode *this,int key,Record *record)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BTLeafNode *this_00;
  Record *local_50;
  Record *r;
  int local_40;
  int k;
  int i;
  bool flag;
  int SM1;
  int SN1;
  int SM;
  int SN;
  BTLeafNode *M;
  Record *record_local;
  int key_local;
  BTLeafNode *this_local;
  
  this_00 = (BTLeafNode *)operator_new(0x278);
  BTLeafNode(this_00);
  this_00->next_ = this->next_;
  this->next_ = this_00;
  iVar2 = BTNode::key_count(&this->super_BTNode);
  iVar3 = (iVar2 + 1) / 2;
  iVar2 = BTNode::key_count(&this->super_BTNode);
  iVar4 = (iVar2 + 1) - iVar3;
  bVar1 = false;
  iVar2 = BTNode::key_count(&this->super_BTNode);
  SM1 = iVar4;
  SN1 = iVar3;
  while (local_40 = iVar2 + -1, -1 < local_40) {
    r._4_4_ = (this->super_BTNode).keys_[local_40];
    local_50 = this->record_links_[local_40];
    if (((this->super_BTNode).keys_[local_40] < key) && (!bVar1)) {
      bVar1 = true;
      local_50 = record;
      r._4_4_ = key;
      local_40 = iVar2;
    }
    iVar2 = local_40;
    if (SM1 < 1) {
      (this->super_BTNode).keys_[SN1 + -1] = r._4_4_;
      this->record_links_[SN1 + -1] = local_50;
      SN1 = SN1 + -1;
    }
    else {
      (this_00->super_BTNode).keys_[SM1 + -1] = r._4_4_;
      this_00->record_links_[SM1 + -1] = local_50;
      SM1 = SM1 + -1;
    }
  }
  if (0 < SN1) {
    (this->super_BTNode).keys_[SN1 + -1] = key;
    this->record_links_[SN1 + -1] = record;
  }
  (this_00->super_BTNode).parent_ = (this->super_BTNode).parent_;
  (this->super_BTNode).used_links_count_ = iVar3 + 1;
  (this_00->super_BTNode).used_links_count_ = iVar4 + 1;
  iVar2 = BTNode::key_count(&this->super_BTNode);
  bVar1 = cc((this->super_BTNode).keys_,iVar2);
  if (bVar1) {
    iVar2 = BTNode::key_count((BTNode *)this_00);
    bVar1 = cc((this_00->super_BTNode).keys_,iVar2);
    if (bVar1) {
      return this_00;
    }
    __assert_fail("cc(M->keys_, M->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x1c8,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
  }
  __assert_fail("cc(this->keys_, this->key_count())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x1c7,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
}

Assistant:

BTLeafNode *BTLeafNode::split(int key, Record *record) {
        BTLeafNode *M = new BTLeafNode;
        M->next_ = this->next_;
        this->next_ = M;
        int SN = (key_count() + 1) / 2;
        int SM = (key_count() + 1) - SN;

        int SN1 = SN, SM1 = SM;

        bool flag = false;  // first
        for (int i = key_count() - 1; i >= 0; --i) {
            int k = keys_[i];
            Record *r = record_links_[i];
            if (keys_[i] < key && !flag) {
                i++;
                k = key;
                r = record;
                flag = true;
            }
            if (SM > 0) {
                M->keys_[SM - 1] = k;
                M->record_links_[SM - 1] = r;
                SM--;
            } else {
                keys_[SN - 1] = k;
                record_links_[SN - 1] = r;
                SN--;
            }
        }
        if (SN > 0) {
            keys_[SN - 1] = key;
            record_links_[SN - 1] = record;
        }
        M->parent_ = parent_;
        this->used_links_count_ = 1 + SN1;
        M->used_links_count_ = 1 + SM1;

        assert(cc(this->keys_, this->key_count()));
        assert(cc(M->keys_, M->key_count()));

        return M;
    }